

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall TPZFMatrix<long>::Substitution(TPZFMatrix<long> *this,TPZFMatrix<long> *B)

{
  bool bVar1;
  ulong uVar2;
  int64_t iVar3;
  int64_t iVar4;
  ulong uVar5;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var6;
  long diff;
  int64_t col_1;
  int64_t col;
  int64_t j;
  int64_t i;
  int64_t row;
  int64_t colb;
  int64_t rowb;
  char *in_stack_00000158;
  char *in_stack_00000160;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  if (in_RDI->fDecomposed != '\x01') {
    Error(in_stack_00000160,in_stack_00000158);
  }
  uVar2 = TPZBaseMatrix::Rows(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  uVar5 = TPZBaseMatrix::Rows(in_RDI);
  if (uVar2 != uVar5) {
    Error(in_stack_00000160,in_stack_00000158);
  }
  for (local_30 = 0; (long)local_30 < (long)uVar2; local_30 = local_30 + 1) {
    for (local_40 = 0; (long)local_40 < iVar3; local_40 = local_40 + 1) {
      for (local_38 = 0; (long)local_38 < (long)local_30; local_38 = local_38 + 1) {
        in_RSI[1].super_TPZSavable._vptr_TPZSavable[(local_40 & 0xffffffff) * uVar2 + local_30] =
             in_RSI[1].super_TPZSavable._vptr_TPZSavable[(local_40 & 0xffffffff) * uVar2 + local_30]
             + -((long)in_RDI[1].super_TPZSavable._vptr_TPZSavable
                       [(local_38 & 0xffffffff) * iVar4 + local_30] *
                (long)in_RSI[1].super_TPZSavable._vptr_TPZSavable
                      [(local_40 & 0xffffffff) * uVar2 + local_38]);
      }
    }
  }
  for (local_48 = 0; local_38 = uVar2, (long)local_48 < iVar3; local_48 = local_48 + 1) {
    while (local_30 = local_38 - 1, -1 < (long)local_30) {
      for (; (long)local_38 < (long)uVar2; local_38 = local_38 + 1) {
        in_RSI[1].super_TPZSavable._vptr_TPZSavable[(local_48 & 0xffffffff) * uVar2 + local_30] =
             in_RSI[1].super_TPZSavable._vptr_TPZSavable[(local_48 & 0xffffffff) * uVar2 + local_30]
             + -((long)in_RDI[1].super_TPZSavable._vptr_TPZSavable
                       [(local_38 & 0xffffffff) * iVar4 + local_30] *
                (long)in_RSI[1].super_TPZSavable._vptr_TPZSavable
                      [(local_48 & 0xffffffff) * uVar2 + local_38]);
      }
      bVar1 = IsZero((int64_t)in_RDI[1].super_TPZSavable._vptr_TPZSavable
                              [(local_30 & 0xffffffff) * iVar4 + local_30]);
      if (bVar1) {
        _Var6 = std::fabs<long>((long)in_RDI[1].super_TPZSavable._vptr_TPZSavable
                                      [(local_30 & 0xffffffff) * iVar4 + local_30]);
        if (_Var6 <= 0.0) {
          Error(in_stack_00000160,in_stack_00000158);
        }
        else {
          _Var6 = std::fabs<long>((long)in_RSI[1].super_TPZSavable._vptr_TPZSavable
                                        [(local_48 & 0xffffffff) * uVar2 + local_30] -
                                  (long)in_RDI[1].super_TPZSavable._vptr_TPZSavable
                                        [(local_30 & 0xffffffff) * iVar4 + local_30]);
          if (1e-12 < _Var6) {
            Error(in_stack_00000160,in_stack_00000158);
          }
        }
      }
      in_RSI[1].super_TPZSavable._vptr_TPZSavable[(local_48 & 0xffffffff) * uVar2 + local_30] =
           (_func_int *)
           ((long)in_RSI[1].super_TPZSavable._vptr_TPZSavable
                  [(local_48 & 0xffffffff) * uVar2 + local_30] /
           (long)in_RDI[1].super_TPZSavable._vptr_TPZSavable
                 [(local_30 & 0xffffffff) * iVar4 + local_30]);
      local_38 = local_30;
    }
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}